

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InMemMsgLoader.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::InMemMsgLoader::loadMsg
          (InMemMsgLoader *this,XMLMsgId msgToLoad,XMLCh *toFill,XMLSize_t maxChars)

{
  bool bVar1;
  XMLCh *local_48;
  XMLCh *srcPtr;
  XMLCh *outPtr;
  XMLCh *endPtr;
  XMLSize_t maxChars_local;
  XMLCh *toFill_local;
  XMLMsgId msgToLoad_local;
  InMemMsgLoader *this_local;
  
  bVar1 = XMLString::equals(this->fMsgDomain,(XMLCh *)XMLUni::fgXMLErrDomain);
  srcPtr = toFill;
  if (bVar1) {
    if (0x120 < msgToLoad) {
      return false;
    }
    local_48 = (XMLCh *)(gXMLErrArray + (ulong)(msgToLoad - 1) * 0x100);
  }
  else {
    bVar1 = XMLString::equals(this->fMsgDomain,(XMLCh *)XMLUni::fgExceptDomain);
    if (bVar1) {
      if (0x171 < msgToLoad) {
        return false;
      }
      local_48 = (XMLCh *)(gXMLExceptArray + (ulong)(msgToLoad - 1) * 0x100);
    }
    else {
      bVar1 = XMLString::equals(this->fMsgDomain,(XMLCh *)XMLUni::fgValidityDomain);
      if (bVar1) {
        if (0x54 < msgToLoad) {
          return false;
        }
        local_48 = (XMLCh *)(gXMLValidityArray + (ulong)(msgToLoad - 1) * 0x100);
      }
      else {
        bVar1 = XMLString::equals(this->fMsgDomain,(XMLCh *)XMLUni::fgXMLDOMMsgDomain);
        if (!bVar1) {
          return false;
        }
        if (0x29 < msgToLoad) {
          return false;
        }
        local_48 = (XMLCh *)(gXMLDOMMsgArray + (ulong)(msgToLoad - 1) * 0x100);
      }
    }
  }
  while (*local_48 != L'\0' && srcPtr < toFill + maxChars) {
    *srcPtr = *local_48;
    local_48 = local_48 + 1;
    srcPtr = srcPtr + 1;
  }
  *srcPtr = L'\0';
  return true;
}

Assistant:

bool InMemMsgLoader::loadMsg(const  XMLMsgLoader::XMLMsgId  msgToLoad
                            ,       XMLCh* const            toFill
                            , const XMLSize_t               maxChars)
{
    //
    //  Just use the id to map into the correct array of messages. Then
    //  copy that to the caller's buffer.
    //
    //  NOTE:   The source text is in little endian form. So, if we are a
    //          big endian machine, flip them in the process.
    //
    XMLCh* endPtr = toFill + maxChars;
    XMLCh* outPtr = toFill;
    const XMLCh* srcPtr = 0;

    if (XMLString::equals(fMsgDomain, XMLUni::fgXMLErrDomain))
    {
        if ( msgToLoad > gXMLErrArraySize)
            return false;
        else
            srcPtr = gXMLErrArray[msgToLoad - 1];
    }
     else if (XMLString::equals(fMsgDomain, XMLUni::fgExceptDomain))
    {
         if ( msgToLoad > gXMLExceptArraySize)
            return false;
         else
             srcPtr = gXMLExceptArray[msgToLoad - 1];
    }
     else if (XMLString::equals(fMsgDomain, XMLUni::fgValidityDomain))
    {
         if ( msgToLoad > gXMLValidityArraySize)
            return false;
         else
             srcPtr = gXMLValidityArray[msgToLoad - 1];
    }
     else if (XMLString::equals(fMsgDomain, XMLUni::fgXMLDOMMsgDomain))
    {
         if ( msgToLoad > gXMLDOMMsgArraySize)
            return false;
         else
             srcPtr = gXMLDOMMsgArray[msgToLoad - 1];
    } else {
	return false;
    }

     while (*srcPtr && (outPtr < endPtr))
     {
         *outPtr++ = *srcPtr++;
     }
     *outPtr = 0;

     return true;
}